

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O0

ssize_t __thiscall
nuraft::FakeClient::send(FakeClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SimpleLogger *this_00;
  int iVar1;
  FakeNetworkBase *this_01;
  undefined8 uVar2;
  element_type *this_02;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  msg_type in_stack_0000004c;
  SimpleLogger *ll;
  FakeNetwork *in_stack_fffffffffffffed8;
  ReqPkg *in_stack_fffffffffffffee0;
  SimpleLogger *in_stack_fffffffffffffee8;
  rpc_handler *in_stack_fffffffffffffef0;
  ReqPkg local_c8;
  string local_98 [48];
  string local_68 [32];
  string local_48 [32];
  SimpleLogger *local_28;
  size_t local_20;
  void *local_18;
  undefined8 local_10;
  FakeClient *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_20 = __n;
  local_18 = __buf;
  local_8 = this;
  this_01 = FakeNetwork::getBase((FakeNetwork *)0x1b750d);
  local_28 = FakeNetworkBase::getLogger(this_01);
  if (local_28 != (SimpleLogger *)0x0) {
    iVar1 = SimpleLogger::getLogLevel(in_stack_fffffffffffffee8);
    this_00 = local_28;
    if (3 < iVar1) {
      FakeNetwork::getEndpoint_abi_cxx11_(in_stack_fffffffffffffed8);
      uVar2 = std::__cxx11::string::c_str();
      FakeNetwork::getEndpoint_abi_cxx11_(in_stack_fffffffffffffed8);
      in_stack_fffffffffffffee0 = (ReqPkg *)std::__cxx11::string::c_str();
      this_02 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b75b3);
      msg_base::get_type(&this_02->super_msg_base);
      msg_type_to_string_abi_cxx11_(in_stack_0000004c);
      in_stack_fffffffffffffee8 = (SimpleLogger *)std::__cxx11::string::c_str();
      SimpleLogger::put(this_00,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                        ,"send",0x135,"got request %s -> %s, %s",uVar2);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
    }
  }
  FakeNetwork::ReqPkg::ReqPkg
            (&local_c8,(ptr<req_msg> *)&this->pendingReqs,in_stack_fffffffffffffef0);
  std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>::
  push_back((list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_> *)
            in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
  FakeNetwork::ReqPkg::~ReqPkg(in_stack_fffffffffffffee0);
  return extraout_RAX;
}

Assistant:

void FakeClient::send(ptr<req_msg>& req,
                      rpc_handler& when_done,
                      uint64_t /*send_timeout_ms*/)
{
    SimpleLogger* ll = motherNet->getBase()->getLogger();
    _log_info(ll, "got request %s -> %s, %s",
              motherNet->getEndpoint().c_str(),
              dstNet->getEndpoint().c_str(),
              msg_type_to_string( req->get_type() ).c_str() );
    pendingReqs.push_back( FakeNetwork::ReqPkg(req, when_done) );
}